

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O3

int ffukym(fitsfile *fptr,char *keyname,double *value,int decim,char *comm,int *status)

{
  int iVar1;
  int iVar2;
  
  iVar2 = *status;
  if (iVar2 < 1) {
    iVar1 = ffmkym(fptr,keyname,value,decim,comm,status);
    if (iVar1 == 0xca) {
      *status = iVar2;
      ffpkym(fptr,keyname,value,decim,comm,status);
    }
    iVar2 = *status;
  }
  return iVar2;
}

Assistant:

int ffukym(fitsfile *fptr,     /* I - FITS file pointer  */
           const char *keyname,/* I - keyword name       */
           double *value,      /* I - keyword value      */
           int decim,          /* I - no of decimals     */
           const char *comm,   /* I - keyword comment    */
           int *status)        /* IO - error status      */
{
    int tstatus;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    tstatus = *status;

    if (ffmkym(fptr, keyname, value, decim, comm, status) == KEY_NO_EXIST)
    {
        *status = tstatus;
        ffpkym(fptr, keyname, value, decim, comm, status);
    }
    return(*status);
}